

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O2

void __thiscall vox::VoxWriter::PrintStats(VoxWriter *this)

{
  Volume *this_00;
  int iVar1;
  pointer pVVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  const_iterator cVar6;
  mapped_type_conflict *pmVar7;
  VoxCube *cube;
  pointer pVVar8;
  map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  frame_counts;
  double local_50;
  double local_40;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"---- Stats ------------------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<((ostream *)&std::cout,"Volume : ");
  this_00 = &this->maxVolume;
  ct::dAABBCC::Size(this_00);
  poVar3 = std::ostream::_M_insert<double>((double)frame_counts._M_t._M_impl._0_8_);
  std::operator<<(poVar3," x ");
  ct::dAABBCC::Size(this_00);
  poVar3 = std::ostream::_M_insert<double>(local_40);
  std::operator<<(poVar3," x ");
  ct::dAABBCC::Size(this_00);
  poVar3 = std::ostream::_M_insert<double>(local_50);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"count cubes : ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  frame_counts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &frame_counts._M_t._M_impl.super__Rb_tree_header._M_header;
  frame_counts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  frame_counts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  frame_counts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pVVar2 = (this->cubes).super__Vector_base<vox::VoxCube,_std::allocator<vox::VoxCube>_>._M_impl.
           super__Vector_impl_data._M_finish;
  frame_counts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       frame_counts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pVVar8 = (this->cubes).super__Vector_base<vox::VoxCube,_std::allocator<vox::VoxCube>_>.
                _M_impl.super__Vector_impl_data._M_start; pVVar8 != pVVar2; pVVar8 = pVVar8 + 1) {
    for (p_Var5 = (pVVar8->xyzis)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(pVVar8->xyzis)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      iVar1 = *(int *)&p_Var5[1]._M_parent;
      pmVar4 = std::
               map<unsigned_int,_unsigned_long,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               ::operator[](&frame_counts,&p_Var5[1]._M_color);
      *pmVar4 = *pmVar4 + (long)iVar1;
    }
  }
  if (1 < frame_counts._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    poVar3 = std::operator<<((ostream *)&std::cout,"count key frames : ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"-----------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar3);
    for (p_Var5 = frame_counts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &frame_counts._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      poVar3 = std::operator<<((ostream *)&std::cout," o--\\-> key frame : ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<((ostream *)&std::cout,"     \\-> voxels count : ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::endl<char,std::char_traits<char>>(poVar3);
      cVar6 = std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::_Select1st<std::pair<const_unsigned_int,_double>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
              ::find(&(this->m_FrameTimes)._M_t,&p_Var5[1]._M_color);
      if ((_Rb_tree_header *)cVar6._M_node !=
          &(this->m_FrameTimes)._M_t._M_impl.super__Rb_tree_header) {
        std::operator<<((ostream *)&std::cout,"      \\-> elapsed time : ");
        pmVar7 = std::
                 map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
                 ::at(&this->m_FrameTimes,&p_Var5[1]._M_color);
        poVar3 = std::ostream::_M_insert<double>(*pmVar7);
        poVar3 = std::operator<<(poVar3," secs");
        std::endl<char,std::char_traits<char>>(poVar3);
      }
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"-----------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"voxels total : ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::operator<<((ostream *)&std::cout,"total elapsed time : ");
  poVar3 = std::ostream::_M_insert<double>(this->m_TotalTime);
  poVar3 = std::operator<<(poVar3," secs");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"-----------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_long>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  ::~_Rb_tree(&frame_counts._M_t);
  return;
}

Assistant:

void VoxWriter::PrintStats() const {
    std::cout << "---- Stats ------------------------------" << std::endl;
    std::cout << "Volume : " << maxVolume.Size().x << " x " << maxVolume.Size().y << " x " << maxVolume.Size().z << std::endl;
    std::cout << "count cubes : " << cubes.size() << std::endl;
    std::map<KeyFrame, size_t> frame_counts;
    for (const auto& cube : cubes) {
        for (auto& key_xyzi : cube.xyzis) {
            frame_counts[key_xyzi.first] += key_xyzi.second.numVoxels;
        }
    }
    size_t voxels_total = 0U;
    if (frame_counts.size() > 1U) {
        std::cout << "count key frames : " << frame_counts.size() << std::endl;
        std::cout << "-----------------------------------------" << std::endl;
        for (const auto& frame_count : frame_counts) {
            std::cout << " o--\\-> key frame : " << frame_count.first << std::endl;
            std::cout << "     \\-> voxels count : " << frame_count.second << std::endl;
            if (m_FrameTimes.find(frame_count.first) != m_FrameTimes.end()) {
                std::cout << "      \\-> elapsed time : " << m_FrameTimes.at(frame_count.first) << " secs" << std::endl;
            }
            voxels_total += frame_count.second;
        }
        std::cout << "-----------------------------------------" << std::endl;
    } else if (!frame_counts.empty()) {
        voxels_total = frame_counts.begin()->second;
    }
    std::cout << "voxels total : " << voxels_total << std::endl;
    std::cout << "total elapsed time : " << m_TotalTime << " secs" << std::endl;
    std::cout << "-----------------------------------------" << std::endl;
}